

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

int lua_resume(lua_State *L,int nargs)

{
  TValue *pTVar1;
  int iVar2;
  GCstr *pGVar3;
  
  if ((L->cframe == (void *)0x0) && (L->status < 2)) {
    iVar2 = lj_vm_resume(L,L->top + -(long)nargs,0,0);
    return iVar2;
  }
  pTVar1 = L->base;
  L->top = pTVar1;
  pGVar3 = lj_err_str(L,LJ_ERR_COSUSP);
  (pTVar1->u32).lo = (uint32_t)pGVar3;
  (pTVar1->field_2).it = 0xfffffffb;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar1 + 1) {
    lj_state_growstack1(L);
  }
  return 2;
}

Assistant:

LUA_API int lua_resume(lua_State *L, int nargs)
{
  if (L->cframe == NULL && L->status <= LUA_YIELD)
    return lj_vm_resume(L,
      L->status == LUA_OK ? api_call_base(L, nargs) : L->top - nargs,
      0, 0);
  L->top = L->base;
  setstrV(L, L->top, lj_err_str(L, LJ_ERR_COSUSP));
  incr_top(L);
  return LUA_ERRRUN;
}